

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O0

void testing::internal::PrintTo(char16_t *s,ostream *os)

{
  ostream *os_local;
  char16_t *s_local;
  
  anon_unknown_35::PrintCStringTo<char16_t>(s,os);
  return;
}

Assistant:

void PrintTo(const char16_t* s, ostream* os) { PrintCStringTo(s, os); }